

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O3

xr_level_game * load<xray_re::xr_level_game>(char *path,char *name,bool required)

{
  int iVar1;
  xr_reader *r;
  xr_level_game *this;
  undefined7 in_register_00000011;
  
  if (xray_re::xr_file_system::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0,name,
                                CONCAT71(in_register_00000011,required));
    if (iVar1 != 0) {
      xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
      __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                   &xray_re::xr_file_system::instance::instance0,&__dso_handle);
      __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
    }
  }
  r = xray_re::xr_file_system::r_open
                (&xray_re::xr_file_system::instance::instance0,path,"level.game");
  if (r == (xr_reader *)0x0) {
    this = (xr_level_game *)0x0;
  }
  else {
    xray_re::msg("loading %s","level.game");
    this = (xr_level_game *)operator_new(0x38);
    this->_vptr_xr_level_game = (_func_int **)&PTR__xr_level_game_00249bc8;
    (this->m_paths).super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_paths).super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_paths).super__Vector_base<xray_re::way_path_*,_std::allocator<xray_re::way_path_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->m_rpoints).
    super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_rpoints).
    super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_rpoints).
    super__Vector_base<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    xray_re::xr_level_game::load(this,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return this;
}

Assistant:

static T* load(const char* path, const char* name, bool required = false)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r) {
		msg("loading %s", name);
		T* instance = new T(*r);
		fs.r_close(r);
		return instance;
	} else if (required) {
		msg("can't load %s", name);
		xr_not_expected();
	}
	return 0;
}